

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall cmStateDirectory::ComputeRelativePathTopBinary(cmStateDirectory *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  pointer this_01;
  ulong uVar3;
  PointerType pBVar4;
  bool local_18a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator local_121;
  cmStateDirectory local_120;
  undefined1 local_f8 [8];
  string currentBinary;
  __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_d0;
  __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_c8;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_c0;
  const_iterator it;
  cmStateDirectory local_b0;
  undefined1 local_88 [8];
  string result;
  undefined1 local_40 [8];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> snapshots;
  cmStateSnapshot snapshot;
  cmStateDirectory *this_local;
  
  snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->Snapshot_).State;
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40,
             (value_type *)
             &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    cmStateSnapshot::GetBuildsystemDirectoryParent
              ((cmStateSnapshot *)((long)&result.field_2 + 8),
               (cmStateSnapshot *)
               &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)result.field_2._8_8_;
    bVar1 = cmStateSnapshot::IsValid
                      ((cmStateSnapshot *)
                       &snapshots.
                        super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
              ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40,
               (value_type *)
               &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::front
                      ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  cmStateSnapshot::GetDirectory(&local_b0,this_00);
  pcVar2 = GetCurrentBinary(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,pcVar2,(allocator *)((long)&it._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_d0._M_current =
       (cmStateSnapshot *)
       std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin
                 ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  local_c8 = __gnu_cxx::
             __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
             ::operator+(&local_d0,1);
  __gnu_cxx::
  __normal_iterator<cmStateSnapshot_const*,std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>>
  ::__normal_iterator<cmStateSnapshot*>
            ((__normal_iterator<cmStateSnapshot_const*,std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>>
              *)&local_c0,&local_c8);
  while( true ) {
    currentBinary.field_2._8_8_ =
         std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end
                   ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c0,
                       (__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                        *)((long)&currentBinary.field_2 + 8));
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
              ::operator->(&local_c0);
    cmStateSnapshot::GetDirectory(&local_120,this_01);
    pcVar2 = GetCurrentBinary(&local_120);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f8,pcVar2,&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_88,(string *)local_f8);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_f8);
    }
    std::__cxx11::string::~string((string *)local_f8);
    __gnu_cxx::
    __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
    ::operator++(&local_c0);
  }
  uVar3 = std::__cxx11::string::size();
  local_18a = true;
  if (1 < uVar3) {
    std::__cxx11::string::substr((ulong)&local_148,(ulong)local_88);
    local_18a = std::operator!=(&local_148,"//");
    std::__cxx11::string::~string((string *)&local_148);
  }
  if (local_18a == false) {
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::__cxx11::string::operator=((string *)&pBVar4->RelativePathTopBinary,"");
  }
  else {
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::__cxx11::string::operator=((string *)&pBVar4->RelativePathTopBinary,(string *)local_88);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  return;
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopBinary()
{
  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentBinary();

  for (std::vector<cmStateSnapshot>::const_iterator it = snapshots.begin() + 1;
       it != snapshots.end(); ++it) {
    std::string currentBinary = it->GetDirectory().GetCurrentBinary();
    if (cmSystemTools::IsSubDirectory(result, currentBinary)) {
      result = currentBinary;
    }
  }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if (result.size() < 2 || result.substr(0, 2) != "//") {
    this->DirectoryState->RelativePathTopBinary = result;
  } else {
    this->DirectoryState->RelativePathTopBinary = "";
  }
}